

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall logger::OutputWorker::Loop(OutputWorker *this)

{
  list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  *this_00;
  list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
  *__x;
  __int_type _Var1;
  int iVar2;
  ostream *poVar3;
  _List_node_base *p_Var4;
  OutputWorker *pOVar5;
  iterator __end2;
  string terminatingMessage;
  string str;
  QueuedMessage qm;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [16];
  OutputWorker local_198;
  
  this_00 = &this->QueuePublic;
  __x = &this->QueuePrivate;
  while (((this->Terminated)._M_base._M_i & 1U) == 0) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_1a8,&this->QueueLock)
    ;
    if ((((this_00->
          super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
          )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)this_00) &&
        (((this->FlushRequested)._M_base._M_i & 1U) == 0)) &&
       (((this->Terminated)._M_base._M_i & 1U) == 0)) {
      std::condition_variable::wait((unique_lock *)&this->QueueCondition);
    }
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::swap(this_00,__x);
    iVar2 = (this->Overrun).super___atomic_base<int>._M_i;
    LOCK();
    (this->Overrun).super___atomic_base<int>._M_i = 0;
    UNLOCK();
    _Var1 = (this->FlushRequested)._M_base._M_i;
    LOCK();
    (this->FlushRequested)._M_base._M_i = false;
    UNLOCK();
    pOVar5 = (OutputWorker *)local_1a8;
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1a8);
    p_Var4 = (_List_node_base *)__x;
    while (p_Var4 = (((_List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                       *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var4 != (_List_node_base *)__x) {
      Log(pOVar5,(QueuedMessage *)(p_Var4 + 1));
    }
    if (0 < iVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar3 = std::operator<<((ostream *)local_1a8,"Queue overrun. Lost ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      std::operator<<(poVar3," log messages");
      std::__cxx11::stringbuf::str();
      local_1f8._0_4_ = Error;
      local_1f8._8_8_ = "Logger";
      pOVar5 = (OutputWorker *)local_1e8;
      std::__cxx11::string::string((string *)pOVar5,(string *)(local_1e8 + 0x20));
      Log(pOVar5,(QueuedMessage *)local_1f8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    }
    std::__cxx11::
    list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
    ::clear(__x);
    if ((_Var1 & 1U) != 0) {
      std::condition_variable::notify_all();
    }
  }
  std::__cxx11::string::string((string *)local_1f8,"Terminating",(allocator *)local_1a8);
  local_1a8._0_4_ = 2;
  local_1a8._8_8_ = "Logger";
  pOVar5 = &local_198;
  std::__cxx11::string::string((string *)&local_198,(string *)local_1f8);
  Log(pOVar5,(QueuedMessage *)local_1a8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)local_1f8);
  return;
}

Assistant:

void OutputWorker::Loop()
{
    while (!Terminated)
    {
        int overrun = 0;
        bool flushRequested = false;
        {
            // unique_lock used since QueueCondition.wait requires it
            std::unique_lock<std::mutex> locker(QueueLock);

            if (QueuePublic.empty() && !FlushRequested && !Terminated)
                QueueCondition.wait(locker);

            std::swap(QueuePublic, QueuePrivate);

#if !defined(LOGGER_NEVER_DROP)
            overrun = Overrun;
            Overrun = 0;
#endif // LOGGER_NEVER_DROP

            flushRequested = FlushRequested;
            FlushRequested = false;
        }

        for (auto& log : QueuePrivate)
            Log(log);

        // Handle log message overrun
        if (overrun > 0)
        {
            std::ostringstream oss;
            oss << "Queue overrun. Lost " << overrun << " log messages";
            std::string str = oss.str();
            QueuedMessage qm(Level::Error, "Logger", str);
            Log(qm);
        }

        QueuePrivate.clear();

        if (flushRequested)
            FlushCondition.notify_all();
    }

    // Log out that logger is terminating
    std::string terminatingMessage = "Terminating";
    QueuedMessage qm(Level::Info, "Logger", terminatingMessage);
    Log(qm);
}